

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

long ftp_timeleft_accept(SessionHandle *data)

{
  long lVar1;
  long lVar2;
  timeval tVar3;
  __time_t local_48;
  __suseconds_t local_40;
  undefined1 local_38 [8];
  timeval now;
  long other;
  long timeout_ms;
  SessionHandle *data_local;
  
  other = 60000;
  if (0 < (data->set).accepttimeout) {
    other = (data->set).accepttimeout;
  }
  tVar3 = curlx_tvnow();
  local_48 = tVar3.tv_sec;
  local_38 = (undefined1  [8])local_48;
  local_40 = tVar3.tv_usec;
  now.tv_sec = local_40;
  now.tv_usec = Curl_timeleft(data,(timeval *)local_38,false);
  if ((now.tv_usec == 0) || (lVar1 = now.tv_usec, other <= now.tv_usec)) {
    tVar3.tv_usec = now.tv_sec;
    tVar3.tv_sec = (__time_t)local_38;
    lVar2 = curlx_tvdiff(tVar3,(data->progress).t_acceptdata);
    lVar1 = other - lVar2;
    if (other - lVar2 == 0) {
      return -1;
    }
  }
  other = lVar1;
  return other;
}

Assistant:

static long ftp_timeleft_accept(struct SessionHandle *data)
{
  long timeout_ms = DEFAULT_ACCEPT_TIMEOUT;
  long other;
  struct timeval now;

  if(data->set.accepttimeout > 0)
    timeout_ms = data->set.accepttimeout;

  now = Curl_tvnow();

  /* check if the generic timeout possibly is set shorter */
  other =  Curl_timeleft(data, &now, FALSE);
  if(other && (other < timeout_ms))
    /* note that this also works fine for when other happens to be negative
       due to it already having elapsed */
    timeout_ms = other;
  else {
    /* subtract elapsed time */
    timeout_ms -= Curl_tvdiff(now, data->progress.t_acceptdata);
    if(!timeout_ms)
      /* avoid returning 0 as that means no timeout! */
      return -1;
  }

  return timeout_ms;
}